

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseXMLParser.cpp
# Opt level: O0

bool __thiscall Rml::BaseXMLParser::ReadCloseTag(BaseXMLParser *this,size_t xml_index_tag)

{
  code *pcVar1;
  bool bVar2;
  ulong uVar3;
  String local_90;
  undefined4 local_70;
  undefined1 local_60 [8];
  String tag_name;
  size_t xml_index_tag_local;
  BaseXMLParser *this_local;
  
  if (((this->inner_xml_data & 1U) != 0) &&
     (this->open_tag_depth == this->inner_xml_data_terminate_depth)) {
    if ((xml_index_tag < this->inner_xml_data_index_begin) &&
       (bVar2 = Assert("RMLUI_ASSERT(inner_xml_data_index_begin <= xml_index_tag)",
                       "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/BaseXMLParser.cpp"
                       ,0x12d), !bVar2)) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    this->inner_xml_data = false;
    ::std::__cxx11::string::substr((ulong)((long)&tag_name.field_2 + 8),(ulong)&this->xml_source);
    ::std::__cxx11::string::operator=
              ((string *)&this->data,(string *)(tag_name.field_2._M_local_buf + 8));
    ::std::__cxx11::string::~string((string *)(tag_name.field_2._M_local_buf + 8));
    HandleDataInternal(this,&this->data,InnerXML);
    ::std::__cxx11::string::clear();
  }
  uVar3 = ::std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    HandleDataInternal(this,&this->data,Text);
    ::std::__cxx11::string::clear();
  }
  ::std::__cxx11::string::string((string *)local_60);
  bVar2 = FindString(this,">",(String *)local_60,false);
  if (bVar2) {
    StringUtilities::StripWhitespace(&local_90,(String *)local_60);
    HandleElementEndInternal(this,&local_90);
    ::std::__cxx11::string::~string((string *)&local_90);
    this->open_tag_depth = this->open_tag_depth + -1;
  }
  local_70 = 1;
  ::std::__cxx11::string::~string((string *)local_60);
  return bVar2;
}

Assistant:

bool BaseXMLParser::ReadCloseTag(const size_t xml_index_tag)
{
	if (inner_xml_data && open_tag_depth == inner_xml_data_terminate_depth)
	{
		// Closing the tag that initiated the inner xml data parsing. Set all its contents as Data to be
		// submitted next, and disable the mode to resume normal parsing behavior.
		RMLUI_ASSERT(inner_xml_data_index_begin <= xml_index_tag);
		inner_xml_data = false;
		data = xml_source.substr(inner_xml_data_index_begin, xml_index_tag - inner_xml_data_index_begin);
		HandleDataInternal(data, XMLDataType::InnerXML);
		data.clear();
	}

	// Closing tag; send data immediately and close the tag.
	if (!data.empty())
	{
		HandleDataInternal(data, XMLDataType::Text);
		data.clear();
	}

	String tag_name;
	if (!FindString(">", tag_name))
		return false;

	HandleElementEndInternal(StringUtilities::StripWhitespace(tag_name));

	// Tag closed, reduce count
	open_tag_depth--;

	return true;
}